

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmBreak(ExpressionContext *ctx,VmModule *module,ExprBreak *node)

{
  LoopInfo *pLVar1;
  VmValue *pVVar2;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pLVar1 = SmallArray<VmModule::LoopInfo,_32U>::operator[]
                     (&module->loopInfo,
                      (module->loopInfo).count - *(int *)&(node->super_ExprBase).field_0x2c);
  anon_unknown.dwarf_20a43d::CreateJump
            (module,(node->super_ExprBase).source,&pLVar1->breakBlock->super_VmValue);
  pVVar2 = anon_unknown.dwarf_20a43d::CreateVoid(module);
  pVVar2 = anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,pVVar2);
  return pVVar2;
}

Assistant:

VmValue* CompileVmBreak(ExpressionContext &ctx, VmModule *module, ExprBreak *node)
{
	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *target = module->loopInfo[module->loopInfo.size() - node->depth].breakBlock;

	CreateJump(module, node->source, target);

	return CheckType(ctx, node, CreateVoid(module));
}